

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

double soplex::LPFreadInfinity<double>(char **pos)

{
  double *pdVar1;
  long *in_RDI;
  double sense;
  char **pos_00;
  
  pos_00 = (char **)0xbff0000000000000;
  if (*(char *)*in_RDI != '-') {
    pos_00 = (char **)0x3ff0000000000000;
  }
  *in_RDI = *in_RDI + 1;
  LPFhasKeyword(pos_00,(char *)0x3ff0000000000000);
  pdVar1 = (double *)infinity();
  return (double)pos_00 * *pdVar1;
}

Assistant:

static R LPFreadInfinity(char*& pos)
{
   assert(LPFisInfinity(pos));

   R sense = (*pos == '-') ? -1.0 : 1.0;

   (void) LPFhasKeyword(++pos, "inf[inity]");

   return sense * R(infinity);
}